

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stealth_strategy.cpp
# Opt level: O3

void __thiscall
StealthStrategy::generateActions(StealthStrategy *this,PlayerSight *sight,Actions *actions)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  Randomizer *this_00;
  int *piVar7;
  Router *this_01;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec2 pos;
  Vec2 pos_00;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (this->field_0xc != '\0') {
    return;
  }
  if (((this->hp_lower_bound < sight->hp) || (sight->canSuckAttack != true)) ||
     (sight->unitInSightCount < 1)) {
    fVar12 = 0.0 - (sight->velocity).x;
    fVar9 = 0.0 - (sight->velocity).y;
    if (0.0001 <= fVar12 * fVar12 + fVar9 * fVar9) {
      return;
    }
    if (this->status != ssStandby) {
      if (this->status != ssWalking) {
        return;
      }
      this->status = ssStandby;
      iVar8 = sight->round;
      this_00 = Randomizer::getInstance();
      iVar6 = Randomizer::randWaitTime(this_00);
      this->activeRound = iVar6 + iVar8;
      return;
    }
    if (sight->round < this->activeRound) {
      return;
    }
    this->status = ssWalking;
    this->activeRound = 0;
    iVar8 = sight->id;
    this_01 = Router::getInstance();
    pos_00 = Router::availablePosition(this_01);
  }
  else {
    piVar7 = *(int **)&sight->unitInSight;
    if (piVar7 == *(int **)&sight->field_0x80) {
      fVar9 = 1e+08;
      fVar12 = 1e+08;
      fVar19 = fVar9;
      fVar21 = fVar12;
    }
    else {
      fVar1 = (sight->pos).x;
      fVar2 = (sight->pos).y;
      fVar9 = 1e+08;
      fVar12 = 1e+08;
      iVar8 = -1;
      fVar13 = 0.0;
      fVar14 = 0.0;
      bVar3 = false;
      fVar22 = 0.0;
      fVar23 = 0.0;
      fVar10 = fVar9;
      fVar11 = fVar12;
      do {
        fVar18 = (float)((ulong)*(undefined8 *)(piVar7 + 1) >> 0x20);
        fVar17 = (float)*(undefined8 *)(piVar7 + 1);
        fVar20 = (fVar17 - fVar1) * (fVar17 - fVar1) + (fVar18 - fVar2) * (fVar18 - fVar2);
        fVar15 = (float)*(undefined8 *)(piVar7 + 3);
        fVar16 = (float)((ulong)*(undefined8 *)(piVar7 + 3) >> 0x20);
        fVar19 = fVar15;
        fVar21 = fVar16;
        fVar4 = fVar17;
        fVar5 = fVar18;
        if ((fVar9 - fVar1) * (fVar9 - fVar1) + (fVar12 - fVar2) * (fVar12 - fVar2) <= fVar20) {
          fVar19 = fVar10;
          fVar21 = fVar11;
          fVar4 = fVar9;
          fVar5 = fVar12;
        }
        fVar12 = fVar5;
        fVar9 = fVar4;
        if (SQRT(fVar20) <= 4.0) {
          if (bVar3) {
            if (fVar20 <= (fVar13 - fVar1) * (fVar13 - fVar1) + (fVar14 - fVar2) * (fVar14 - fVar2))
            goto LAB_00104f51;
          }
          else {
            bVar3 = true;
          }
          fVar13 = fVar17;
          fVar14 = fVar18;
          fVar22 = fVar15;
          fVar23 = fVar16;
          iVar8 = *piVar7;
        }
LAB_00104f51:
        piVar7 = piVar7 + 5;
        fVar10 = fVar19;
        fVar11 = fVar21;
      } while (piVar7 != *(int **)&sight->field_0x80);
      if (bVar3) {
        pos.y = fVar14;
        pos.x = fVar13;
        Actions::emplace(actions,SuckAttack,iVar8,pos);
        iVar8 = sight->id;
        pos_00.x = (sight->pos).x + fVar22 * -10.0;
        pos_00.y = (sight->pos).y + fVar23 * -10.0;
        goto LAB_00104fbe;
      }
    }
    pos_00.x = fVar19 + fVar9;
    pos_00.y = fVar21 + fVar12;
    iVar8 = sight->id;
  }
LAB_00104fbe:
  Actions::emplace(actions,SelectDestination,iVar8,pos_00);
  return;
}

Assistant:

void StealthStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.hp <= hp_lower_bound && sight.canSuckAttack && sight.unitInSightCount > 0)
    {
        PUnitInfo nearest, choice;
        nearest.pos = Vec2(FINF, FINF);
        nearest.velocity = Vec2(FINF, FINF);
        bool found = false;
        for (auto uinfo : sight.unitInSight) {
            if ((nearest.pos - sight.pos).len2() > (uinfo.pos - sight.pos).len2())
                nearest = uinfo;
            if ((uinfo.pos - sight.pos).length() <= SuckRange) {
                if (!found) {
                    found = true;
                    choice = uinfo;
                } else if ((choice.pos - sight.pos).len2() < (uinfo.pos - sight.pos).len2())
                    choice = uinfo;
            }
        }

        if (sight.unitInSightCount != 0)
        {
            if (!found)
                actions->emplace(SelectDestination, sight.id, nearest.pos + nearest.velocity);
            else
            {
                actions->emplace(SuckAttack, choice.id, choice.pos);
                actions->emplace(SelectDestination, sight.id, sight.pos - (choice.velocity * 10.));
            }
            return;
        }
    }
    if (sight.velocity == Vec2())
    {
        if (status == ssWalking)    //开始等待
        {
            status = ssStandby;
            activeRound = sight.round + Randomizer::getInstance()->randWaitTime();
        }
        else if (status == ssStandby && sight.round >= activeRound)
        {
            status = ssWalking;
            activeRound = 0;
            actions->emplace(SelectDestination, sight.id, Router::getInstance()->availablePosition());
        }
    }
}